

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

string * __thiscall
Assimp::parseUTF16String_abi_cxx11_
          (string *__return_storage_ptr__,Assimp *this,uint8_t *data,size_t len)

{
  DeadlyImportError *this_00;
  size_t i;
  ulong uVar1;
  short v;
  vector<short,_std::allocator<short>_> utf16;
  
  if (((ulong)data & 1) == 0) {
    utf16.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    utf16.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    utf16.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<short,_std::allocator<short>_>::reserve(&utf16,(ulong)data >> 1);
    for (uVar1 = 0; (ulong)data >> 1 != uVar1; uVar1 = uVar1 + 1) {
      v = *(ushort *)(this + uVar1 * 2) << 8 | *(ushort *)(this + uVar1 * 2) >> 8;
      std::vector<short,_std::allocator<short>_>::push_back(&utf16,&v);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    utf8::
    utf16to8<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>,std::back_insert_iterator<std::__cxx11::string>>
              ((__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
               utf16.super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
               utf16.super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__return_storage_ptr__);
    std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
              (&utf16.super__Vector_base<short,_std::allocator<short>_>);
    return __return_storage_ptr__;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::string parseUTF16String(const uint8_t *data, size_t len) {
    if (len & 1) {
        throw DeadlyImportError(parseErrorMessage);
    }
    size_t numShorts = len / 2;
    std::vector<short> utf16;
    utf16.reserve(numShorts);
    for (size_t i = 0; i < numShorts; ++i) {
        short v = (data[0] << 8) | data[1];
        utf16.push_back(v);
        data += 2;
    }
    std::string result;
    utf8::utf16to8(utf16.begin(), utf16.end(), back_inserter(result));
    return result;
}